

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O0

StringRef __thiscall llvm::StringRef::ltrim(StringRef *this,StringRef Chars)

{
  StringRef SVar1;
  unsigned_long *puVar2;
  char *pcVar3;
  size_type local_a8;
  StringRef *local_a0;
  StringRef *this_local;
  StringRef Chars_local;
  unsigned_long local_50 [2];
  ulong local_40;
  StringRef *local_38;
  
  Chars_local.Data = (char *)Chars.Length;
  this_local = (StringRef *)Chars.Data;
  local_a0 = this;
  local_a8 = find_first_not_of(this,Chars,0);
  puVar2 = std::min<unsigned_long>(&this->Length,&local_a8);
  local_40 = *puVar2;
  if (this->Length < local_40) {
    __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                  ,0x286,"StringRef llvm::StringRef::drop_front(size_t) const");
  }
  local_50[1] = 0xffffffffffffffff;
  local_38 = this;
  puVar2 = std::min<unsigned_long>(&local_40,&this->Length);
  local_40 = *puVar2;
  pcVar3 = this->Data + local_40;
  local_50[0] = this->Length - local_40;
  puVar2 = std::min<unsigned_long>(local_50 + 1,local_50);
  SVar1.Length = *puVar2;
  SVar1.Data = pcVar3;
  return SVar1;
}

Assistant:

LLVM_NODISCARD
    StringRef ltrim(StringRef Chars = " \t\n\v\f\r") const {
      return drop_front(std::min(Length, find_first_not_of(Chars)));
    }